

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-vec.c
# Opt level: O0

void tcg_gen_cmpsel_vec_mips64
               (TCGContext_conflict5 *tcg_ctx,TCGCond cond,uint vece,TCGv_vec r,TCGv_vec a,
               TCGv_vec b,TCGv_vec c,TCGv_vec d)

{
  TCGType type_00;
  int iVar1;
  TCGTemp *ts;
  TCGTemp *ts_00;
  TCGTemp *ts_01;
  TCGTemp *ts_02;
  TCGTemp *ts_03;
  TCGArg a0;
  TCGArg a_00;
  TCGArg b_00;
  TCGArg c_00;
  TCGArg d_00;
  TCGOpcode *n;
  TCGv_vec r_00;
  undefined8 in_stack_ffffffffffffff50;
  undefined4 uVar2;
  TCGv_vec t;
  int can;
  TCGOpcode *hold_list;
  TCGType type;
  TCGArg di;
  TCGArg ci;
  TCGArg bi;
  TCGArg ai;
  TCGArg ri;
  TCGTemp *dt;
  TCGTemp *ct;
  TCGTemp *bt;
  TCGTemp *at;
  TCGTemp *rt;
  TCGv_vec b_local;
  TCGv_vec a_local;
  TCGv_vec r_local;
  uint vece_local;
  TCGCond cond_local;
  TCGContext_conflict5 *tcg_ctx_local;
  
  uVar2 = (undefined4)((ulong)in_stack_ffffffffffffff50 >> 0x20);
  ts = tcgv_vec_temp(tcg_ctx,r);
  ts_00 = tcgv_vec_temp(tcg_ctx,a);
  ts_01 = tcgv_vec_temp(tcg_ctx,b);
  ts_02 = tcgv_vec_temp(tcg_ctx,c);
  ts_03 = tcgv_vec_temp(tcg_ctx,d);
  a0 = temp_arg(ts);
  a_00 = temp_arg(ts_00);
  b_00 = temp_arg(ts_01);
  c_00 = temp_arg(ts_02);
  d_00 = temp_arg(ts_03);
  type_00 = (TCGType)((ulong)*(undefined8 *)ts >> 0x10) & 0xff;
  tcg_assert_listed_vecop(INDEX_op_cmpsel_vec);
  n = tcg_swap_vecop_list((TCGOpcode *)0x0);
  iVar1 = tcg_can_emit_vec_op_mips64(tcg_ctx,INDEX_op_cmpsel_vec,type_00,vece);
  if (iVar1 < 1) {
    if (iVar1 < 0) {
      tcg_expand_vec_op_mips64
                (tcg_ctx,INDEX_op_cmpsel_vec,type_00,vece,a0,a_00,b_00,c_00,d_00,
                 CONCAT44(uVar2,cond));
    }
    else {
      r_00 = tcg_temp_new_vec_mips64(tcg_ctx,type_00);
      tcg_gen_cmp_vec_mips64(tcg_ctx,cond,vece,r_00,a,b);
      tcg_gen_bitsel_vec_mips64(tcg_ctx,vece,r,r_00,c,d);
      tcg_temp_free_vec(tcg_ctx,r_00);
    }
  }
  else {
    vec_gen_6(tcg_ctx,INDEX_op_cmpsel_vec,type_00,vece,a0,a_00,b_00,c_00,d_00,(ulong)cond);
  }
  tcg_swap_vecop_list(n);
  return;
}

Assistant:

void tcg_gen_cmpsel_vec(TCGContext *tcg_ctx, TCGCond cond, unsigned vece, TCGv_vec r,
                        TCGv_vec a, TCGv_vec b, TCGv_vec c, TCGv_vec d)
{
    TCGTemp *rt = tcgv_vec_temp(tcg_ctx, r);
    TCGTemp *at = tcgv_vec_temp(tcg_ctx, a);
    TCGTemp *bt = tcgv_vec_temp(tcg_ctx, b);
    TCGTemp *ct = tcgv_vec_temp(tcg_ctx, c);
    TCGTemp *dt = tcgv_vec_temp(tcg_ctx, d);
    TCGArg ri = temp_arg(rt);
    TCGArg ai = temp_arg(at);
    TCGArg bi = temp_arg(bt);
    TCGArg ci = temp_arg(ct);
    TCGArg di = temp_arg(dt);
    TCGType type = rt->base_type;
    const TCGOpcode *hold_list;
    int can;

    tcg_debug_assert(at->base_type >= type);
    tcg_debug_assert(bt->base_type >= type);
    tcg_debug_assert(ct->base_type >= type);
    tcg_debug_assert(dt->base_type >= type);

    tcg_assert_listed_vecop(INDEX_op_cmpsel_vec);
    hold_list = tcg_swap_vecop_list(NULL);
    can = tcg_can_emit_vec_op(tcg_ctx, INDEX_op_cmpsel_vec, type, vece);

    if (can > 0) {
        vec_gen_6(tcg_ctx, INDEX_op_cmpsel_vec, type, vece, ri, ai, bi, ci, di, cond);
    } else if (can < 0) {
        tcg_expand_vec_op(tcg_ctx, INDEX_op_cmpsel_vec, type, vece,
                          ri, ai, bi, ci, di, cond);
    } else {
        TCGv_vec t = tcg_temp_new_vec(tcg_ctx, type);
        tcg_gen_cmp_vec(tcg_ctx, cond, vece, t, a, b);
        tcg_gen_bitsel_vec(tcg_ctx, vece, r, t, c, d);
        tcg_temp_free_vec(tcg_ctx, t);
    }
    tcg_swap_vecop_list(hold_list);
}